

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::cose::Sign1Message::AddAttribute
          (Error *__return_storage_ptr__,Sign1Message *this,int aKey,ByteArray *aValue,int aFlags)

{
  char cVar1;
  uint8_t *data;
  uint8_t *puVar2;
  cn_cbor *value;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  string local_a8;
  undefined1 local_88 [8];
  char *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  parse_func local_60 [1];
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  data = (aValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar2 = (aValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (data == puVar2) {
    local_88._0_4_ = none_type;
    local_80 = "add empty COSE SIGN1 message attribute";
    local_78 = 0x26;
    local_70._M_allocated_capacity = 0;
    local_60[0] = (parse_func)0x0;
    pcVar3 = "add empty COSE SIGN1 message attribute";
    write.handler_ = (format_string_checker<char> *)local_88;
    local_70._8_8_ = (format_string_checker<char> *)local_88;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar3,"");
          goto LAB_0016bdfb;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",(format_string_checker<char> *)local_88);
    }
LAB_0016bdfb:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,(v10 *)"add empty COSE SIGN1 message attribute",(string_view)ZEXT816(0x26),
               args);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_a8);
  }
  else {
    value = cn_cbor_data_create(data,(int)puVar2 - (int)data,(cn_cbor_errback *)0x0);
    if (value != (cn_cbor *)0x0) {
      AddAttribute((Error *)local_88,this,aKey,value,aFlags);
      Error::operator=(__return_storage_ptr__,(Error *)local_88);
      std::__cxx11::string::~string((string *)&local_80);
      if (value->parent != (cn_cbor *)0x0) {
        return __return_storage_ptr__;
      }
      cn_cbor_free(value);
      return __return_storage_ptr__;
    }
    local_88._0_4_ = none_type;
    local_80 = "add COSE SIGN1 message attribute";
    local_78 = 0x20;
    local_70._M_allocated_capacity = 0;
    local_60[0] = (parse_func)0x0;
    pcVar3 = "add COSE SIGN1 message attribute";
    write.handler_ = (format_string_checker<char> *)local_88;
    local_70._8_8_ = (format_string_checker<char> *)local_88;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar3,"");
          goto LAB_0016bec5;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",(format_string_checker<char> *)local_88);
    }
LAB_0016bec5:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,(v10 *)"add COSE SIGN1 message attribute",(string_view)ZEXT816(0x20),
               args_00);
    local_58._0_4_ = kOutOfMemory;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_a8);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::AddAttribute(int aKey, const ByteArray &aValue, int aFlags)
{
    Error    error;
    cn_cbor *cbor = nullptr;

    VerifyOrExit(!aValue.empty(), error = ERROR_INVALID_ARGS("add empty COSE SIGN1 message attribute"));
    cbor = cn_cbor_data_create(&aValue[0], aValue.size(), nullptr);
    VerifyOrExit(cbor != nullptr, error = ERROR_OUT_OF_MEMORY("add COSE SIGN1 message attribute"));

    SuccessOrExit(error = AddAttribute(aKey, cbor, aFlags));

exit:
    if (cbor != nullptr && cbor->parent == nullptr)
    {
        cn_cbor_free(cbor);
    }
    return error;
}